

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O0

void __thiscall
HighsDomain::CutpoolPropagation::updateActivityUbChange
          (CutpoolPropagation *this,HighsInt col,double oldbound,double newbound)

{
  long in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  anon_class_32_4_88ab020a *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  HighsInt HVar1;
  HighsDynamicRowMatrix *in_stack_ffffffffffffffb0;
  HighsDynamicRowMatrix *this_00;
  
  HVar1 = (HighsInt)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (in_XMM0_Qa < in_XMM1_Qa) {
    HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
    HighsDynamicRowMatrix::
    forEachPositiveColumnEntry<HighsDomain::CutpoolPropagation::updateActivityUbChange(int,double,double)::__0>
              (in_stack_ffffffffffffffb0,HVar1,(anon_class_24_3_d34410f1 *)in_stack_ffffffffffffffa0
              );
  }
  HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
  this_00 = (HighsDynamicRowMatrix *)&stack0xffffffffffffffe0;
  HVar1 = (HighsInt)((ulong)&stack0xffffffffffffffe8 >> 0x20);
  HighsDynamicRowMatrix::
  forEachNegativeColumnEntry<HighsDomain::CutpoolPropagation::updateActivityUbChange(int,double,double)::__1>
            (this_00,HVar1,in_stack_ffffffffffffffa0);
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x280) & 1) != 0) {
    std::swap<double>((double *)&stack0xffffffffffffffe8,(double *)&stack0xffffffffffffffe0);
    HighsCutPool::getMatrix(*(HighsCutPool **)(in_RDI + 0x10));
    HighsDynamicRowMatrix::
    forEachNegativeColumnEntry<HighsDomain::CutpoolPropagation::updateActivityUbChange(int,double,double)::__2>
              (this_00,HVar1,(anon_class_24_3_6cf9384c *)&stack0xffffffffffffffe0);
  }
  return;
}

Assistant:

void HighsDomain::CutpoolPropagation::updateActivityUbChange(HighsInt col,
                                                             double oldbound,
                                                             double newbound) {
  assert(!domain->infeasible_);

  if (newbound > oldbound) {
    cutpool->getMatrix().forEachPositiveColumnEntry(
        col, [&](HighsInt row, double val) {
          domain->updateThresholdUbChange(col, newbound, val,
                                          capacityThreshold_[row]);
          return true;
        });
  }

  cutpool->getMatrix().forEachNegativeColumnEntry(
      col, [&](HighsInt row, double val) {
        assert(val < 0);
        HighsCDouble deltamin = computeDelta(val, oldbound, newbound, kHighsInf,
                                             activitycutsinf_[row]);
        activitycuts_[row] += deltamin;

        if (deltamin <= 0) {
          domain->updateThresholdUbChange(col, newbound, val,
                                          capacityThreshold_[row]);
          return true;
        }

        if (activitycutsinf_[row] == 0 &&
            activitycuts_[row] - cutpool->getRhs()[row] >
                domain->mipsolver->mipdata_->feastol) {
          domain->mipsolver->mipdata_->debugSolution.nodePruned(*domain);
          domain->infeasible_ = true;
          domain->infeasible_pos = domain->domchgstack_.size();
          domain->infeasible_reason = Reason::cut(cutpoolindex, row);
          return false;
        }

        markPropagateCut(row);

        return true;
      });

  if (domain->infeasible_) {
    assert(domain->infeasible_reason.type == cutpoolindex);
    assert(domain->infeasible_reason.index >= 0);
    std::swap(oldbound, newbound);
    cutpool->getMatrix().forEachNegativeColumnEntry(
        col, [&](HighsInt row, double val) {
          assert(val < 0);
          activitycuts_[row] += computeDelta(val, oldbound, newbound, kHighsInf,
                                             activitycutsinf_[row]);

          if (domain->infeasible_reason.index == row) return false;

          return true;
        });
  }
}